

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O0

void garray_cosinesum(_garray *x,t_symbol *s,int argc,t_atom *argv)

{
  int nsin;
  t_float *vsin;
  t_float tVar1;
  t_float tVar2;
  int local_3c;
  int i;
  long npoints;
  t_float *svec;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  _garray *x_local;
  
  if (argc < 2) {
    pd_error((void *)0x0,"sinesum: %s: need number of points and partial strengths",
             x->x_realname->s_name);
  }
  else {
    tVar1 = atom_getfloatarg(0,argc,argv);
    nsin = argc + -1;
    vsin = (t_float *)getbytes((long)nsin << 2);
    if (vsin != (t_float *)0x0) {
      for (local_3c = 0; local_3c < nsin; local_3c = local_3c + 1) {
        tVar2 = atom_getfloatarg(local_3c,nsin,argv + 1);
        vsin[local_3c] = tVar2;
      }
      garray_dofo(x,(long)tVar1,0.0,nsin,vsin,0);
      freebytes(vsin,(long)nsin << 2);
    }
  }
  return;
}

Assistant:

static void garray_cosinesum(t_garray *x, t_symbol *s, int argc, t_atom *argv)
{
    t_float *svec;
    long npoints;
    int i;
    if (argc < 2)
    {
        pd_error(0, "sinesum: %s: need number of points and partial strengths",
            x->x_realname->s_name);
        return;
    }

    npoints = atom_getfloatarg(0, argc, argv);
    argv++, argc--;

    svec = (t_float *)t_getbytes(sizeof(t_float) * argc);
    if (!svec) return;

    for (i = 0; i < argc; i++)
        svec[i] = atom_getfloatarg(i, argc, argv);
    garray_dofo(x, npoints, 0, argc, svec, 0);
    t_freebytes(svec, sizeof(t_float) * argc);
}